

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_grandfather.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  int iVar1;
  bool bVar2;
  undefined1 local_50 [8];
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  d;
  int local_10;
  int m;
  int n;
  
  m = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>(this,(int *)((long)&d._M_h._M_single_bucket + 4));
  std::
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  ::unordered_map((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                   *)local_50);
  while (iVar1 = local_10 + -1, bVar2 = local_10 != 0, local_10 = iVar1, bVar2) {
    get_father_son((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                    *)local_50);
  }
  while (d._M_h._M_single_bucket._4_4_ != 0) {
    d._M_h._M_single_bucket._4_4_ = d._M_h._M_single_bucket._4_4_ + -1;
    solve((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           *)local_50);
  }
  d._M_h._M_single_bucket._4_4_ = d._M_h._M_single_bucket._4_4_ + -1;
  std::
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  ::~unordered_map((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                    *)local_50);
  return m;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int n, m;
    cin >> n >> m;
    unordered_map<long long, long long> d;
    while (n--)
        get_father_son(d);
    while (m--)
        solve(d);
}